

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

unsigned_long
AdaptingProcess(PaUtilBufferProcessor *bp,int *streamCallbackResult,int processPartialUserBuffers)

{
  unsigned_long uVar1;
  PaUtilChannelDescriptor *pPVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong local_98;
  ulong local_90;
  uint local_80;
  uint local_7c;
  uint j;
  uint i;
  uint destChannelStrideBytes;
  uint destSampleStrideSamples;
  uchar *destBytePtr;
  uint frameCount;
  PaUtilChannelDescriptor *hostOutputChannels;
  PaUtilChannelDescriptor *hostInputChannels;
  unsigned_long maxFramesToCopy;
  unsigned_long endProcessingMinFrameCount;
  unsigned_long framesAvailable;
  unsigned_long framesProcessed;
  void *userOutput;
  void *userInput;
  int processPartialUserBuffers_local;
  int *streamCallbackResult_local;
  PaUtilBufferProcessor *bp_local;
  
  framesAvailable = 0;
  endProcessingMinFrameCount = bp->hostInputFrameCount[0] + bp->hostInputFrameCount[1];
  if (processPartialUserBuffers == 0) {
    maxFramesToCopy = bp->framesPerUserBuffer - 1;
  }
  else {
    maxFramesToCopy = 0;
  }
  CopyTempOutputBuffersToHostOutputBuffers(bp);
  while (maxFramesToCopy < endProcessingMinFrameCount) {
    if ((bp->framesInTempOutputBuffer == 0) && (*streamCallbackResult != 0)) {
      for (local_7c = 0; local_7c < 2; local_7c = local_7c + 1) {
        uVar3 = (uint)bp->hostOutputFrameCount[local_7c];
        if (uVar3 != 0) {
          pPVar2 = bp->hostOutputChannels[local_7c];
          for (local_80 = 0; local_80 < bp->outputChannelCount; local_80 = local_80 + 1) {
            (*bp->outputZeroer)(pPVar2[local_80].data,pPVar2[local_80].stride,uVar3);
            pPVar2[local_80].data =
                 (void *)((long)pPVar2[local_80].data +
                         (ulong)(uVar3 * pPVar2[local_80].stride * bp->bytesPerHostOutputSample));
          }
          bp->hostOutputFrameCount[local_7c] = 0;
        }
      }
    }
    while( true ) {
      bVar5 = false;
      if (bp->framesInTempInputBuffer < bp->framesPerUserBuffer) {
        bVar5 = bp->hostInputFrameCount[0] + bp->hostInputFrameCount[1] != 0;
      }
      if (!bVar5) break;
      local_98 = bp->framesPerUserBuffer - bp->framesInTempInputBuffer;
      if (bp->hostInputFrameCount[0] == 0) {
        hostOutputChannels = bp->hostInputChannels[1];
        if (bp->hostInputFrameCount[1] < local_98) {
          local_98 = bp->hostInputFrameCount[1];
        }
        destBytePtr._4_4_ = (uint)local_98;
      }
      else {
        hostOutputChannels = bp->hostInputChannels[0];
        local_90 = local_98;
        if (bp->hostInputFrameCount[0] < local_98) {
          local_90 = bp->hostInputFrameCount[0];
        }
        destBytePtr._4_4_ = (uint)local_90;
      }
      if (bp->userInputIsInterleaved == 0) {
        _destChannelStrideBytes =
             (void *)((long)bp->tempInputBuffer +
                     (ulong)bp->bytesPerUserInputSample * bp->framesInTempInputBuffer);
        i = 1;
        j = (int)bp->framesPerUserBuffer * bp->bytesPerUserInputSample;
      }
      else {
        _destChannelStrideBytes =
             (void *)((long)bp->tempInputBuffer +
                     (ulong)(bp->bytesPerUserInputSample * bp->inputChannelCount) *
                     bp->framesInTempInputBuffer);
        i = bp->inputChannelCount;
        j = bp->bytesPerUserInputSample;
      }
      for (local_7c = 0; local_7c < bp->inputChannelCount; local_7c = local_7c + 1) {
        (*bp->inputConverter)
                  (_destChannelStrideBytes,i,hostOutputChannels[local_7c].data,
                   hostOutputChannels[local_7c].stride,destBytePtr._4_4_,&bp->ditherGenerator);
        _destChannelStrideBytes = (void *)((long)_destChannelStrideBytes + (ulong)j);
        hostOutputChannels[local_7c].data =
             (void *)((long)hostOutputChannels[local_7c].data +
                     (ulong)(destBytePtr._4_4_ * hostOutputChannels[local_7c].stride *
                            bp->bytesPerHostInputSample));
      }
      if (bp->hostInputFrameCount[0] == 0) {
        bp->hostInputFrameCount[1] = bp->hostInputFrameCount[1] - (ulong)destBytePtr._4_4_;
      }
      else {
        bp->hostInputFrameCount[0] = bp->hostInputFrameCount[0] - (ulong)destBytePtr._4_4_;
      }
      bp->framesInTempInputBuffer = (ulong)destBytePtr._4_4_ + bp->framesInTempInputBuffer;
      endProcessingMinFrameCount = endProcessingMinFrameCount - destBytePtr._4_4_;
      framesAvailable = destBytePtr._4_4_ + framesAvailable;
    }
    if ((bp->framesInTempInputBuffer == bp->framesPerUserBuffer) &&
       (bp->framesInTempOutputBuffer == 0)) {
      if (*streamCallbackResult == 0) {
        if (bp->userInputIsInterleaved == 0) {
          for (local_7c = 0; local_7c < bp->inputChannelCount; local_7c = local_7c + 1) {
            bp->tempInputBufferPtrs[local_7c] =
                 (void *)((long)bp->tempInputBuffer +
                         (ulong)local_7c * bp->framesPerUserBuffer *
                         (ulong)bp->bytesPerUserInputSample);
          }
          userOutput = bp->tempInputBufferPtrs;
        }
        else {
          userOutput = bp->tempInputBuffer;
        }
        if (bp->userOutputIsInterleaved == 0) {
          for (local_7c = 0; local_7c < bp->outputChannelCount; local_7c = local_7c + 1) {
            bp->tempOutputBufferPtrs[local_7c] =
                 (void *)((long)bp->tempOutputBuffer +
                         (ulong)local_7c * bp->framesPerUserBuffer *
                         (ulong)bp->bytesPerUserOutputSample);
          }
          framesProcessed = (unsigned_long)bp->tempOutputBufferPtrs;
        }
        else {
          framesProcessed = (unsigned_long)bp->tempOutputBuffer;
        }
        iVar4 = (*bp->streamCallback)
                          (userOutput,(void *)framesProcessed,bp->framesPerUserBuffer,bp->timeInfo,
                           bp->callbackStatusFlags,bp->userData);
        *streamCallbackResult = iVar4;
        uVar1 = bp->framesPerUserBuffer;
        auVar6._8_4_ = (int)(uVar1 >> 0x20);
        auVar6._0_8_ = uVar1;
        auVar6._12_4_ = 0x45300000;
        bp->timeInfo->inputBufferAdcTime =
             ((auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * bp->samplePeriod +
             bp->timeInfo->inputBufferAdcTime;
        uVar1 = bp->framesPerUserBuffer;
        auVar7._8_4_ = (int)(uVar1 >> 0x20);
        auVar7._0_8_ = uVar1;
        auVar7._12_4_ = 0x45300000;
        bp->timeInfo->outputBufferDacTime =
             ((auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * bp->samplePeriod +
             bp->timeInfo->outputBufferDacTime;
        bp->framesInTempInputBuffer = 0;
        if (*streamCallbackResult == 2) {
          bp->framesInTempOutputBuffer = 0;
        }
        else {
          bp->framesInTempOutputBuffer = bp->framesPerUserBuffer;
        }
      }
      else {
        bp->framesInTempInputBuffer = 0;
      }
    }
    CopyTempOutputBuffersToHostOutputBuffers(bp);
  }
  return framesAvailable;
}

Assistant:

static unsigned long AdaptingProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult, int processPartialUserBuffers )
{
    void *userInput, *userOutput;
    unsigned long framesProcessed = 0;
    unsigned long framesAvailable;
    unsigned long endProcessingMinFrameCount;
    unsigned long maxFramesToCopy;
    PaUtilChannelDescriptor *hostInputChannels, *hostOutputChannels;
    unsigned int frameCount;
    unsigned char *destBytePtr;
    unsigned int destSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int destChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i, j;


    framesAvailable = bp->hostInputFrameCount[0] + bp->hostInputFrameCount[1];/* this is assumed to be the same as the output buffer's frame count */

    if( processPartialUserBuffers )
        endProcessingMinFrameCount = 0;
    else
        endProcessingMinFrameCount = (bp->framesPerUserBuffer - 1);

    /* Fill host output with remaining frames in user output (tempOutputBuffer) */
    CopyTempOutputBuffersToHostOutputBuffers( bp );

    while( framesAvailable > endProcessingMinFrameCount )
    {

        if( bp->framesInTempOutputBuffer == 0 && *streamCallbackResult != paContinue )
        {
            /* the callback will not be called any more, so zero what remains
                of the host output buffers */

            for( i=0; i<2; ++i )
            {
                frameCount = bp->hostOutputFrameCount[i];
                if( frameCount > 0 )
                {
                    hostOutputChannels = bp->hostOutputChannels[i];

                    for( j=0; j<bp->outputChannelCount; ++j )
                    {
                        bp->outputZeroer(   hostOutputChannels[j].data,
                                            hostOutputChannels[j].stride,
                                            frameCount );

                        /* advance dest ptr for next iteration  */
                        hostOutputChannels[j].data = ((unsigned char*)hostOutputChannels[j].data) +
                                frameCount * hostOutputChannels[j].stride * bp->bytesPerHostOutputSample;
                    }
                    bp->hostOutputFrameCount[i] = 0;
                }
            }
        }


        /* copy frames from host to user input buffers */
        while( bp->framesInTempInputBuffer < bp->framesPerUserBuffer &&
                ((bp->hostInputFrameCount[0] + bp->hostInputFrameCount[1]) > 0) )
        {
            maxFramesToCopy = bp->framesPerUserBuffer - bp->framesInTempInputBuffer;

            /* select the input buffer set (1st or 2nd) */
            if( bp->hostInputFrameCount[0] > 0 )
            {
                hostInputChannels = bp->hostInputChannels[0];
                frameCount = PA_MIN_( bp->hostInputFrameCount[0], maxFramesToCopy );
            }
            else
            {
                hostInputChannels = bp->hostInputChannels[1];
                frameCount = PA_MIN_( bp->hostInputFrameCount[1], maxFramesToCopy );
            }

            /* configure conversion destination pointers */
            if( bp->userInputIsInterleaved )
            {
                destBytePtr = ((unsigned char*)bp->tempInputBuffer) +
                        bp->bytesPerUserInputSample * bp->inputChannelCount *
                        bp->framesInTempInputBuffer;

                destSampleStrideSamples = bp->inputChannelCount;
                destChannelStrideBytes = bp->bytesPerUserInputSample;
            }
            else /* user input is not interleaved */
            {
                destBytePtr = ((unsigned char*)bp->tempInputBuffer) +
                        bp->bytesPerUserInputSample * bp->framesInTempInputBuffer;

                destSampleStrideSamples = 1;
                destChannelStrideBytes = bp->framesPerUserBuffer * bp->bytesPerUserInputSample;
            }

            for( i=0; i<bp->inputChannelCount; ++i )
            {
                bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                        hostInputChannels[i].data,
                                        hostInputChannels[i].stride,
                                        frameCount, &bp->ditherGenerator );

                destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */

                /* advance src ptr for next iteration */
                hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                        frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
            }

            if( bp->hostInputFrameCount[0] > 0 )
                bp->hostInputFrameCount[0] -= frameCount;
            else
                bp->hostInputFrameCount[1] -= frameCount;

            bp->framesInTempInputBuffer += frameCount;

            /* update framesAvailable and framesProcessed based on input consumed
                unless something is very wrong this will also correspond to the
                amount of output generated */
            framesAvailable -= frameCount;
            framesProcessed += frameCount;
        }

        /* call streamCallback */
        if( bp->framesInTempInputBuffer == bp->framesPerUserBuffer &&
            bp->framesInTempOutputBuffer == 0 )
        {
            if( *streamCallbackResult == paContinue )
            {
                /* setup userInput */
                if( bp->userInputIsInterleaved )
                {
                    userInput = bp->tempInputBuffer;
                }
                else /* user input is not interleaved */
                {
                    for( i = 0; i < bp->inputChannelCount; ++i )
                    {
                        bp->tempInputBufferPtrs[i] = ((unsigned char*)bp->tempInputBuffer) +
                                i * bp->framesPerUserBuffer * bp->bytesPerUserInputSample;
                    }

                    userInput = bp->tempInputBufferPtrs;
                }

                /* setup userOutput */
                if( bp->userOutputIsInterleaved )
                {
                    userOutput = bp->tempOutputBuffer;
                }
                else /* user output is not interleaved */
                {
                    for( i = 0; i < bp->outputChannelCount; ++i )
                    {
                        bp->tempOutputBufferPtrs[i] = ((unsigned char*)bp->tempOutputBuffer) +
                                i * bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
                    }

                    userOutput = bp->tempOutputBufferPtrs;
                }

                /* call streamCallback */

                *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                        bp->framesPerUserBuffer, bp->timeInfo,
                        bp->callbackStatusFlags, bp->userData );

                bp->timeInfo->inputBufferAdcTime += bp->framesPerUserBuffer * bp->samplePeriod;
                bp->timeInfo->outputBufferDacTime += bp->framesPerUserBuffer * bp->samplePeriod;

                bp->framesInTempInputBuffer = 0;

                if( *streamCallbackResult == paAbort )
                    bp->framesInTempOutputBuffer = 0;
                else
                    bp->framesInTempOutputBuffer = bp->framesPerUserBuffer;
            }
            else
            {
                /* paComplete or paAbort has already been called. */

                bp->framesInTempInputBuffer = 0;
            }
        }

        /* copy frames from user (tempOutputBuffer) to host output buffers (hostOutputChannels)
           Means to process the user output provided by the callback. Has to be called after
            each callback. */
        CopyTempOutputBuffersToHostOutputBuffers( bp );

    }

    return framesProcessed;
}